

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-types.hh
# Opt level: O1

normal3f tinyusdz::vcross(normal3f *a,normal3f *b)

{
  normal3f nVar1;
  
  nVar1.x = a->y * b->z - b->y * a->z;
  nVar1.y = a->z * b->x - b->z * a->x;
  nVar1.z = a->x * b->y - b->x * a->y;
  return nVar1;
}

Assistant:

float operator[](size_t idx) const { return *(&x + idx); }